

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn_codecs_prim.c
# Opt level: O1

asn_dec_rval_t
xer_decode_primitive
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **sptr,size_t struct_size,
          char *opt_mname,void *buf_ptr,size_t size,xer_primitive_body_decoder_f *prim_body_decoder)

{
  asn_dec_rval_t aVar1;
  undefined1 auVar2 [16];
  asn_dec_rval_code_e aVar3;
  xer_pbd_rval xVar4;
  void *pvVar5;
  ulong uVar6;
  asn_dec_rval_t aVar7;
  char ch;
  xdp_arg_s s_arg;
  asn_struct_ctx_t s_ctx;
  
  if (opt_mname == (char *)0x0) {
    opt_mname = td->xml_tag;
  }
  if (*sptr == (void *)0x0) {
    pvVar5 = calloc(1,struct_size);
    *sptr = pvVar5;
    if (pvVar5 == (void *)0x0) {
      uVar6 = 2;
      goto LAB_0014abcf;
    }
  }
  s_ctx.phase = 0;
  s_ctx.step = 0;
  s_ctx.context = 0;
  s_ctx.ptr = (void *)0x0;
  s_ctx.left = 0;
  s_arg.struct_key = *sptr;
  s_arg.prim_body_decoder = prim_body_decoder;
  s_arg.decoded_something = 0;
  s_arg.want_more = 0;
  s_arg.type_descriptor = td;
  aVar7 = xer_decode_general(opt_codec_ctx,&s_ctx,&s_arg,opt_mname,buf_ptr,size,
                             xer_decode__unexpected_tag,xer_decode__primitive_body);
  uVar6 = aVar7._0_8_;
  aVar3 = aVar7.code;
  if (aVar3 == RC_FAIL) {
    uVar6 = (ulong)((s_arg.want_more == 0) + 1);
  }
  else if (aVar3 != RC_WMORE) {
    if (aVar3 != RC_OK) {
      return aVar7;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = aVar7.consumed;
    if (s_arg.decoded_something != 0) {
      return (asn_dec_rval_t)(auVar2 << 0x40);
    }
    xVar4 = (*prim_body_decoder)(s_arg.type_descriptor,s_arg.struct_key,&ch,0);
    uVar6 = aVar7.consumed;
    if (xVar4 != XPBD_BODY_CONSUMED) {
      uVar6 = 0;
    }
    aVar7._4_4_ = 0;
    aVar7.code = (uint)(xVar4 != XPBD_BODY_CONSUMED) * 2;
    aVar7.consumed = uVar6;
    return aVar7;
  }
LAB_0014abcf:
  aVar1.consumed = 0;
  aVar1._0_8_ = uVar6;
  return aVar1;
}

Assistant:

asn_dec_rval_t
xer_decode_primitive(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td,
	void **sptr,
	size_t struct_size,
	const char *opt_mname,
	const void *buf_ptr, size_t size,
	xer_primitive_body_decoder_f *prim_body_decoder
) {
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;
	asn_struct_ctx_t s_ctx;
	struct xdp_arg_s s_arg;
	asn_dec_rval_t rc;

	/*
	 * Create the structure if does not exist.
	 */
	if(!*sptr) {
		*sptr = CALLOC(1, struct_size);
		if(!*sptr) ASN__DECODE_FAILED;
	}

	memset(&s_ctx, 0, sizeof(s_ctx));
	s_arg.type_descriptor = td;
	s_arg.struct_key = *sptr;
	s_arg.prim_body_decoder = prim_body_decoder;
	s_arg.decoded_something = 0;
	s_arg.want_more = 0;

	rc = xer_decode_general(opt_codec_ctx, &s_ctx, &s_arg,
		xml_tag, buf_ptr, size,
		xer_decode__unexpected_tag, xer_decode__primitive_body);
	switch(rc.code) {
	case RC_OK:
		if(!s_arg.decoded_something) {
			char ch;
			ASN_DEBUG("Primitive body is not recognized, "
				"supplying empty one");
			/*
			 * Decoding opportunity has come and gone.
			 * Where's the result?
			 * Try to feed with empty body, see if it eats it.
			 */
			if(prim_body_decoder(s_arg.type_descriptor,
				s_arg.struct_key, &ch, 0)
					!= XPBD_BODY_CONSUMED) {
				/*
				 * This decoder does not like empty stuff.
				 */
				ASN__DECODE_FAILED;
			}
		}
		break;
	case RC_WMORE:
		/*
		 * Redo the whole thing later.
		 * We don't have a context to save intermediate parsing state.
		 */
		rc.consumed = 0;
		break;
	case RC_FAIL:
		rc.consumed = 0;
		if(s_arg.want_more)
			rc.code = RC_WMORE;
		else
			ASN__DECODE_FAILED;
		break;
	}
	return rc;
}